

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

void Bac_ObjSetIndex(Bac_Ntk_t *p,int i,int x)

{
  if ((i < 0) || ((p->vType).nSize <= i)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if (9 < (byte)(p->vType).pArray[(uint)i]) {
    __assert_fail("Bac_ObjIsCio(p, i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bac.h"
                  ,0x11e,"int Bac_ObjIndex(Bac_Ntk_t *, int)");
  }
  if (i < (p->vIndex).nSize) {
    if ((p->vIndex).pArray[(uint)i] != -1) {
      __assert_fail("Bac_ObjIndex(p, i) == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bac.h"
                    ,299,"void Bac_ObjSetIndex(Bac_Ntk_t *, int, int)");
    }
    Vec_IntFillExtra(&p->vIndex,i + 1,0);
    if (i < (p->vIndex).nSize) {
      (p->vIndex).pArray[(uint)i] = x;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline void           Bac_ObjSetIndex( Bac_Ntk_t * p, int i, int x )  { assert(Bac_ObjIndex(p, i) == -1); Vec_IntSetEntry( &p->vIndex, i, x );                      }